

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void DeleteObservation(pyhanabi_observation_t *observation)

{
  long *in_RDI;
  HanabiObservation *this;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x284,"void DeleteObservation(pyhanabi_observation_t *)");
  }
  if (*in_RDI != 0) {
    this = (HanabiObservation *)*in_RDI;
    if (this != (HanabiObservation *)0x0) {
      hanabi_learning_env::HanabiObservation::~HanabiObservation(this);
      operator_delete(this);
    }
    *in_RDI = 0;
    return;
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x285,"void DeleteObservation(pyhanabi_observation_t *)");
}

Assistant:

void DeleteObservation(pyhanabi_observation_t* observation) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  delete reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
      observation->observation);
  observation->observation = nullptr;
}